

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

BasicBrokerInfo * __thiscall
helics::CoreBroker::getBrokerById(CoreBroker *this,GlobalBrokerId brokerid)

{
  bool bVar1;
  long in_RDI;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  fnd;
  BaseType brkNum;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffffb8;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffffc0;
  GlobalBrokerId *in_stack_ffffffffffffffd0;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  in_stack_ffffffffffffffd8;
  GlobalBrokerId local_c;
  BasicBrokerInfo *local_8;
  
  if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
    ::find((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
            *)in_stack_ffffffffffffffd8._M_current,in_stack_ffffffffffffffd0);
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::
            operator==<helics::BasicBrokerInfo_*,_const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                      ((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_8 = (BasicBrokerInfo *)0x0;
    }
    else {
      local_8 = __gnu_cxx::
                __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                ::operator*((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                             *)&stack0xffffffffffffffd8);
    }
  }
  else {
    GlobalBrokerId::localIndex(&local_c);
    bVar1 = isValidIndex<int,gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>>
                      ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_8 = gmlc::containers::
                DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                ::operator[](in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    }
    else {
      local_8 = (BasicBrokerInfo *)0x0;
    }
  }
  return local_8;
}

Assistant:

BasicBrokerInfo* CoreBroker::getBrokerById(GlobalBrokerId brokerid)
{
    if (isRootc) {
        auto brkNum = brokerid.localIndex();
        return (isValidIndex(brkNum, mBrokers) ? &mBrokers[brkNum] : nullptr);
    }

    auto fnd = mBrokers.find(brokerid);
    return (fnd != mBrokers.end()) ? &(*fnd) : nullptr;
}